

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge_iterator.hpp
# Opt level: O2

merge_iterator<burst::owning_iterator<std::vector<boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>,_std::allocator<boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>_>_>_>,_std::less<void>_>
* __thiscall
burst::
make_merge_iterator<boost::iterator_range<std::istream_iterator<int,char,std::char_traits<char>,long>>,boost::iterator_range<std::istream_iterator<int,char,std::char_traits<char>,long>>>
          (merge_iterator<burst::owning_iterator<std::vector<boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>,_std::allocator<boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>_>_>_>,_std::less<void>_>
           *__return_storage_ptr__,burst *this,
          tuple<boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>_&,_boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>_&>
          *ranges)

{
  iterator_range<burst::owning_iterator<std::vector<boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>,_std::allocator<boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>_>_>_>_>
  *ranges_00;
  _Vector_base<boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>,_std::allocator<boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>_>_>
  local_70;
  iterator_range_base<burst::owning_iterator<std::vector<boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>,_std::allocator<boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>_>_>_>,_boost::iterators::incrementable_traversal_tag>
  local_58;
  undefined4 local_28;
  undefined4 uStack_24;
  undefined4 uStack_20;
  undefined4 uStack_1c;
  
  local_28 = *(undefined4 *)this;
  uStack_24 = *(undefined4 *)(this + 4);
  uStack_20 = *(undefined4 *)(this + 8);
  uStack_1c = *(undefined4 *)(this + 0xc);
  detail::
  apply_impl<burst::make_range_vector_t_const&,std::tuple<boost::iterator_range<std::istream_iterator<int,char,std::char_traits<char>,long>>&,boost::iterator_range<std::istream_iterator<int,char,std::char_traits<char>,long>>&>&,0ul,1ul>
            (&local_70,(detail *)&make_range_vector);
  own_as_range_t::operator()
            ((iterator_range<burst::owning_iterator<std::vector<boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>,_std::allocator<boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>_>_>_>_>
              *)&local_58,(own_as_range_t *)&own_as_range,
             (vector<boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>,_std::allocator<boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>_>_>
              *)&local_70);
  make_merge_iterator<boost::iterator_range<burst::owning_iterator<std::vector<boost::iterator_range<std::istream_iterator<int,char,std::char_traits<char>,long>>,std::allocator<boost::iterator_range<std::istream_iterator<int,char,std::char_traits<char>,long>>>>>>>
            (__return_storage_ptr__,(burst *)&local_58,ranges_00);
  boost::iterator_range_detail::
  iterator_range_base<burst::owning_iterator<std::vector<boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>,_std::allocator<boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>_>_>_>,_boost::iterators::incrementable_traversal_tag>
  ::~iterator_range_base(&local_58);
  std::
  _Vector_base<boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>,_std::allocator<boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>_>_>
  ::~_Vector_base(&local_70);
  return __return_storage_ptr__;
}

Assistant:

auto make_merge_iterator (std::tuple<Ranges &...> ranges)
    {
        auto common_ranges = detail::uniform_range_tuple_please(ranges);
        return make_merge_iterator(own_as_range(burst::apply(make_range_vector, common_ranges)));
    }